

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O0

void ga_sort_scat_scpl_(Integer *pn,SingleComplex *v,Integer *i,Integer *j,Integer *base)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  SingleComplex in_R8;
  Integer *p;
  unsigned_long g;
  unsigned_long gap;
  long ib_2;
  long ia_2;
  SingleComplex dtmp_2;
  Integer ltmp_2;
  long ib_1;
  long ia_1;
  SingleComplex dtmp_1;
  Integer ltmp_1;
  long ib;
  long ia;
  SingleComplex dtmp;
  Integer ltmp;
  Integer *base0;
  Integer n;
  Integer *hi;
  Integer *q;
  
  if (1 < (long)*in_RDI) {
    dtmp = (SingleComplex)((long)*in_RDI >> 1);
    dtmp_1 = (SingleComplex)((undefined8 *)((long)in_R8 + -8) + (long)dtmp * 2);
    if ((*in_RDI & 1) != 0) {
      dtmp_1 = (SingleComplex)((long)dtmp_1 + 8);
    }
    for (; dtmp != (SingleComplex)0x1; dtmp = (SingleComplex)((long)dtmp + -1)) {
      ia._0_4_ = dtmp.real;
      ia._4_4_ = dtmp.imag;
      ib = (long)((undefined8 *)((long)in_R8 + -8) + (long)dtmp);
      while (ltmp_1 = ib + ia * 8, (ulong)ltmp_1 <= (ulong)dtmp_1) {
        ia = ia * 2;
        if (((SingleComplex)ltmp_1 != dtmp_1) && (*(long *)ltmp_1 < *(long *)(ltmp_1 + 8))) {
          ltmp_1 = ltmp_1 + 8;
          ia = ia + 1;
        }
        if (*(long *)ltmp_1 <= *(long *)ib) break;
        lVar2 = ib - (long)in_R8 >> 3;
        lVar3 = ltmp_1 - (long)in_R8 >> 3;
        uVar1 = *(undefined8 *)ib;
        *(undefined8 *)ib = *(undefined8 *)ltmp_1;
        *(undefined8 *)ltmp_1 = uVar1;
        uVar1 = in_RSI[lVar2];
        in_RSI[lVar2] = in_RSI[lVar3];
        in_RSI[lVar3] = uVar1;
        uVar1 = in_RDX[lVar2];
        in_RDX[lVar2] = in_RDX[lVar3];
        in_RDX[lVar3] = uVar1;
        uVar1 = in_RCX[lVar2];
        in_RCX[lVar2] = in_RCX[lVar3];
        in_RCX[lVar3] = uVar1;
        ib = ltmp_1;
      }
    }
    for (; dtmp_1 != in_R8; dtmp_1 = (SingleComplex)((long)dtmp_1 + -8)) {
      ia = 1;
      ib = (long)in_R8;
      while (ltmp_1 = ib + ia * 8, (ulong)ltmp_1 <= (ulong)dtmp_1) {
        ia = ia * 2;
        if (((SingleComplex)ltmp_1 != dtmp_1) && (*(long *)ltmp_1 < *(long *)(ltmp_1 + 8))) {
          ltmp_1 = ltmp_1 + 8;
          ia = ia + 1;
        }
        if (*(long *)ltmp_1 <= *(long *)ib) break;
        lVar2 = ib - (long)in_R8 >> 3;
        lVar3 = ltmp_1 - (long)in_R8 >> 3;
        uVar1 = *(undefined8 *)ib;
        *(undefined8 *)ib = *(undefined8 *)ltmp_1;
        *(undefined8 *)ltmp_1 = uVar1;
        uVar1 = in_RSI[lVar2];
        in_RSI[lVar2] = in_RSI[lVar3];
        in_RSI[lVar3] = uVar1;
        uVar1 = in_RDX[lVar2];
        in_RDX[lVar2] = in_RDX[lVar3];
        in_RDX[lVar3] = uVar1;
        uVar1 = in_RCX[lVar2];
        in_RCX[lVar2] = in_RCX[lVar3];
        in_RCX[lVar3] = uVar1;
        ib = ltmp_1;
      }
      lVar2 = (long)dtmp_1 - (long)in_R8 >> 3;
      uVar1 = *(undefined8 *)in_R8;
      *(undefined8 *)in_R8 = *(undefined8 *)dtmp_1;
      *(undefined8 *)dtmp_1 = uVar1;
      uVar1 = *in_RSI;
      *in_RSI = in_RSI[lVar2];
      in_RSI[lVar2] = uVar1;
      uVar1 = *in_RDX;
      *in_RDX = in_RDX[lVar2];
      in_RDX[lVar2] = uVar1;
      uVar1 = *in_RCX;
      *in_RCX = in_RCX[lVar2];
      in_RCX[lVar2] = uVar1;
    }
  }
  return;
}

Assistant:

static void ga_sort_scat_scpl_(pn, v, i, j, base)
     Integer *pn;
     SingleComplex *v;
     Integer *i;
     Integer *j;
     Integer *base;
{

  if (*pn < 2) return;

#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    SingleComplex dtmp; \
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    dtmp=v[ia]; v[ia]=v[ib]; v[ib]=dtmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}